

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd.c
# Opt level: O0

size_t count_encoded_length(size_t n,size_t prefix)

{
  ulong uVar1;
  undefined8 local_30;
  size_t len;
  size_t k;
  size_t prefix_local;
  size_t n_local;
  
  uVar1 = (ulong)((1 << ((byte)prefix & 0x1f)) + -1);
  if (n < uVar1) {
    n_local = 1;
  }
  else {
    local_30 = 1;
    for (prefix_local = n - uVar1; 0x7f < prefix_local; prefix_local = prefix_local >> 7) {
      local_30 = local_30 + 1;
    }
    n_local = local_30 + 1;
  }
  return n_local;
}

Assistant:

static size_t count_encoded_length(size_t n, size_t prefix) {
  size_t k = (size_t)((1 << prefix) - 1);
  size_t len = 0;

  if (n < k) {
    return 1;
  }

  n -= k;
  ++len;

  for (; n >= 128; n >>= 7, ++len)
    ;

  return len + 1;
}